

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionF<Counter<unsigned_int,32u>,Counter<unsigned_char,8u>>(int bias)

{
  uint uVar1;
  uint uVar2;
  uint absDiff;
  uint uVar3;
  uint uVar4;
  uint recent;
  uint uVar5;
  int delta;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  bVar8 = false;
  uVar3 = 0;
  do {
    uVar4 = uVar3 & 0xff;
    uVar5 = 0;
    do {
      iVar6 = uVar3 - uVar5;
      if (uVar3 < uVar5 || iVar6 == 0) {
        if ((int)(uVar5 - uVar3) <= (int)(bias + 0x80U)) goto LAB_001025fa;
      }
      else if (iVar6 < (int)(0x80U - bias)) {
LAB_001025fa:
        uVar7 = uVar5 & 0x100 | uVar4;
        uVar1 = uVar5 & 0xff;
        if (uVar1 < uVar4) {
          uVar2 = uVar7 - 0x100;
          if (uVar4 - uVar1 < 0x80U - bias) {
            uVar2 = uVar7;
          }
        }
        else {
          uVar2 = uVar7 + 0x100;
          if (uVar1 - uVar4 <= bias + 0x80U) {
            uVar2 = uVar7;
          }
        }
        if (uVar2 != uVar3) {
          return bVar8;
        }
        if ((bias == 0) && ((int)(char)iVar6 + uVar5 != uVar3)) {
          return bVar8;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x200);
    bVar8 = 0x1fe < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x200) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}